

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

void __thiscall
Qentem::Array<Qentem::Value<char>_>::operator+=
          (Array<Qentem::Value<char>_> *this,Array<Qentem::Value<char>_> *src)

{
  SizeT SVar1;
  Value<char> *pointer;
  SizeT SVar2;
  uint uVar3;
  
  if (this->capacity_ == 0) {
    this->storage_ = src->storage_;
    SVar1 = src->capacity_;
    this->index_ = src->index_;
    this->capacity_ = SVar1;
  }
  else {
    uVar3 = this->index_;
    SVar2 = src->index_;
    SVar1 = SVar2 + uVar3;
    if (this->capacity_ < SVar1) {
      resize(this,SVar1);
      uVar3 = this->index_;
      SVar2 = src->index_;
    }
    Memory::Copy<unsigned_int>(this->storage_ + uVar3,src->storage_,SVar2 * 0x18);
    pointer = src->storage_;
    if (pointer != (Value<char> *)0x0) {
      MemoryRecord::RemoveAllocation(pointer);
    }
    operator_delete(pointer);
    this->index_ = SVar1;
  }
  src->storage_ = (Value<char> *)0x0;
  src->index_ = 0;
  src->capacity_ = 0;
  return;
}

Assistant:

void operator+=(Array &&src) {
        if (Capacity() == 0) {
            setStorage(src.Storage());
            setSize(src.Size());
            setCapacity(src.Capacity());
        } else {
            constexpr SizeT32 type_size = sizeof(Type_T);
            const SizeT       n_size    = (Size() + src.Size());

            if (n_size > Capacity()) {
                resize(n_size);
            }

            Memory::Copy((Storage() + Size()), src.Storage(), (src.Size() * type_size));
            Memory::Deallocate(src.Storage());
            setSize(n_size);
        }

        src.clearStorage();
        src.setSize(0);
        src.setCapacity(0);
    }